

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

ON_XMLNode * __thiscall ON_PostEffect::XMLNode(ON_PostEffect *this)

{
  ON_XMLRootNode *pOVar1;
  
  pOVar1 = (ON_XMLRootNode *)CImpl::PepNode(this->_impl);
  if (pOVar1 == (ON_XMLRootNode *)0x0) {
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
               ,0x1a2,"","false is false");
    pOVar1 = &g_panic_node;
  }
  return &pOVar1->super_ON_XMLNode;
}

Assistant:

ON_XMLNode& ON_PostEffect::XMLNode(void)
{
  auto* pep_node = _impl->PepNode();
  if (nullptr != pep_node)
    return *pep_node;

  // Should never get here.
  ON_ASSERT(false);
  return g_panic_node;
}